

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_equivalence_test.h
# Opt level: O2

ostream * libaom_test::operator<<
                    (ostream *os,
                    FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int)>
                    *p)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"bit_depth:");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,p->bit_depth);
  poVar1 = std::operator<<(poVar1," function:");
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  poVar1 = std::operator<<(poVar1," function:");
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  return poVar1;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const FuncParam<T> &p) {
  return os << "bit_depth:" << p.bit_depth
            << " function:" << reinterpret_cast<const void *>(p.ref_func)
            << " function:" << reinterpret_cast<const void *>(p.tst_func);
}